

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O2

ScopeID * __thiscall
mocker::SymTbl::createSubscope(ScopeID *__return_storage_ptr__,SymTbl *this,ScopeID *pntID)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  element_type *peVar4;
  shared_ptr<mocker::SymTbl::Scope> pnt;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  SymTbl local_50;
  unsigned_long local_40;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  getScope(&local_50,(ScopeID *)this);
  peVar4 = local_50.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::make_shared<mocker::SymTbl::Scope,std::shared_ptr<mocker::SymTbl::Scope>&>
            ((shared_ptr<mocker::SymTbl::Scope> *)&local_68);
  std::
  vector<std::shared_ptr<mocker::SymTbl::Scope>,std::allocator<std::shared_ptr<mocker::SymTbl::Scope>>>
  ::emplace_back<std::shared_ptr<mocker::SymTbl::Scope>>
            ((vector<std::shared_ptr<mocker::SymTbl::Scope>,std::allocator<std::shared_ptr<mocker::SymTbl::Scope>>>
              *)&peVar4->subscopes,(shared_ptr<mocker::SymTbl::Scope> *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_68._M_impl.super__Vector_impl_data._M_finish);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,&pntID->ids);
  local_40 = ((long)((local_50.root.
                      super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->subscopes).
                    super__Vector_base<std::shared_ptr<mocker::SymTbl::Scope>,_std::allocator<std::shared_ptr<mocker::SymTbl::Scope>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)((local_50.root.
                      super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->subscopes).
                    super__Vector_base<std::shared_ptr<mocker::SymTbl::Scope>,_std::allocator<std::shared_ptr<mocker::SymTbl::Scope>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,&local_40);
  puVar3 = local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar2 = local_68._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = local_68._M_impl.super__Vector_impl_data._M_start;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar1;
  (__return_storage_ptr__->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar2;
  (__return_storage_ptr__->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar3;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

ScopeID SymTbl::createSubscope(const ScopeID &pntID) {
  auto pnt = getScope(pntID);
  pnt->subscopes.emplace_back(std::make_shared<Scope>(pnt));
  auto id = pntID.ids;
  id.emplace_back(pnt->subscopes.size() - 1);
  return ScopeID(std::move(id));
}